

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void dump_row(long count,int numinrow,int *chs)

{
  ushort **ppuVar1;
  int iVar2;
  ulong uVar3;
  
  printf("%08lX:",count - numinrow);
  if (0 < numinrow) {
    uVar3 = 0;
    do {
      if (uVar3 == 8) {
        printf(" :");
      }
      printf(" %02X",(ulong)(uint)chs[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)numinrow != uVar3);
    if (numinrow < 0x10) {
      iVar2 = 0x10 - numinrow;
      do {
        if (iVar2 == 8) {
          printf(" :");
        }
        printf("   ");
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    uVar3 = 0;
    printf("  ");
    ppuVar1 = __ctype_b_loc();
    do {
      iVar2 = 0x2e;
      if (((*ppuVar1)[chs[uVar3]] >> 0xe & 1) != 0) {
        iVar2 = chs[uVar3];
      }
      putchar(iVar2);
      uVar3 = uVar3 + 1;
    } while ((uint)numinrow != uVar3);
  }
  putchar(10);
  return;
}

Assistant:

static void dump_row(long count, int numinrow, int *chs)
{
  int i;

  printf("%08lX:", count - numinrow);

  if (numinrow > 0) {
    for (i = 0; i < numinrow; i++) {
      if (i == 8) {
        printf(" :");
      }
      printf(" %02X", chs[i]);
    }
    for (i = numinrow; i < 16; i++) {
      if (i == 8) {
        printf(" :");
      }
      printf("   ");
    }
    printf("  ");
    for (i = 0; i < numinrow; i++) {
      if (isprint(chs[i])) {
        printf("%c", chs[i]);
      } else {
        printf(".");
      }
    }
  }
  printf("\n");
}